

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O1

bool __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
eqParticles_<pica::Particle<(pica::Dimension)2>,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ConstParticleRef>
          (BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *this,
          Particle<(pica::Dimension)2> a,ConstParticleRef b)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  int d;
  uint uVar6;
  long lVar7;
  ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *pPVar8;
  long lVar9;
  ConstParticleRef local_68;
  MomentumType local_58;
  double local_40;
  double local_38;
  undefined8 uStack_30;
  
  local_68.particles = b.particles;
  local_68.idx = b.idx;
  local_58.x = 0.0;
  local_58.y = 0.0;
  lVar7 = 0;
  pPVar8 = local_68.particles;
  do {
    (&local_58.x)[lVar7] =
         pPVar8->positions[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[local_68.idx];
    lVar7 = lVar7 + 1;
    pPVar8 = (ParticleArraySoA<pica::Particle<(pica::Dimension)2>_> *)(pPVar8->positions + 1);
  } while (lVar7 == 1);
  bVar4 = false;
  bVar5 = false;
  if ((((a.position.x == local_58.x) && (bVar5 = bVar4, !NAN(a.position.x) && !NAN(local_58.x))) &&
      (a.position.y == local_58.y)) && (!NAN(a.position.y) && !NAN(local_58.y))) {
    lVar9 = (long)a.typeIndex * 0x10;
    local_38 = *(double *)(pica::ParticleTypes::types + lVar9);
    uStack_30 = 0;
    local_40 = a.p.x * 29979245800.0 * local_38;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMomentum
              (&local_58,&local_68);
    bVar5 = false;
    if ((local_40 == local_58.x) && (!NAN(local_40) && !NAN(local_58.x))) {
      auVar3._8_8_ = -(ulong)(local_58.z == local_38 * a.p.z * 29979245800.0);
      auVar3._0_8_ = -(ulong)(local_58.y == local_38 * a.p.y * 29979245800.0);
      uVar6 = movmskpd((int)lVar7,auVar3);
      if (((uVar6 & 1) != 0) && ((byte)((byte)uVar6 >> 1) != 0)) {
        lVar7 = (long)((local_68.particles)->typeIndex).
                      super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_start[local_68.idx] * 0x10;
        pdVar1 = (double *)(pica::ParticleTypes::types + lVar7);
        if ((((*(double *)(pica::ParticleTypes::types + lVar9) != *pdVar1) ||
             (NAN(*(double *)(pica::ParticleTypes::types + lVar9)) || NAN(*pdVar1))) ||
            (dVar2 = *(double *)(pica::ParticleTypes::types + 8 + lVar9),
            pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar7), dVar2 != *pdVar1)) ||
           (NAN(dVar2) || NAN(*pdVar1))) {
          bVar5 = false;
        }
        else {
          bVar5 = (bool)(-(((local_68.particles)->factors).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[local_68.idx] == a.factor) & 1);
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool eqParticles_(ConstParticleRef1 a, ConstParticleRef2 b) const
    {
        return (a.getPosition() == b.getPosition()) &&
            (a.getMomentum() == b.getMomentum()) &&
            (a.getMass() == b.getMass()) &&
            (a.getCharge() == b.getCharge()) &&
            (a.getFactor() == b.getFactor());
    }